

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

bool __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChContinuumSPH>::IsPolymorphic
          (ChFunctorArchiveInSpecific<chrono::ChContinuumSPH> *this)

{
  ChExceptionArchive *this_00;
  string local_40;
  
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot call IsPolymorphic() for a constructed object.","");
  ChExceptionArchive::ChExceptionArchive(this_00,&local_40);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

virtual bool IsPolymorphic() 
        { throw (ChExceptionArchive( "Cannot call IsPolymorphic() for a constructed object.")); }